

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void or(ch_compilation *comp)

{
  ch_jmpptr patch_address;
  ch_jmpptr patch_address_00;
  ch_op op;
  
  patch_address = emit_jump(comp,OP_JMP_FALSE);
  patch_address_00 = emit_jump(comp,OP_JMP);
  patch_jump(comp,patch_address);
  op = OP_POP;
  ch_emit_write(&((comp->emit).emit_scope)->bytecode,&op,1);
  parse(comp,PREC_OR);
  patch_jump(comp,patch_address_00);
  return;
}

Assistant:

void or(ch_compilation* comp) {
  ch_dataptr patch_false = emit_jump(comp, OP_JMP_FALSE);  
  ch_dataptr patch_true = emit_jump(comp, OP_JMP); // If true, no need to evaluate the next expression
  patch_jump(comp, patch_false);
  EMIT_OP(GET_EMIT(comp), OP_POP);
  parse(comp, PREC_OR);
  patch_jump(comp, patch_true);
}